

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall pbrt::Instance::getBounds(box3f *__return_storage_ptr__,Instance *this)

{
  mutex *__mutex;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  undefined8 uVar10;
  box3f *pbVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  box3f ob;
  box3f local_50;
  undefined1 local_38 [16];
  
  if (this->haveComputedBounds == true) {
    fVar18 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar18;
    fVar18 = (this->bounds).lower.y;
    uVar10 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar18;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar10;
  }
  else {
    __mutex = &this->mutex;
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar9 != 0) {
      uVar10 = std::__throw_system_error(iVar9);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar10);
    }
    if (this->haveComputedBounds == true) {
      fVar18 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar18;
      uVar10._0_4_ = (this->bounds).lower.x;
      uVar10._4_4_ = (this->bounds).lower.y;
      uVar12 = *(undefined8 *)&(this->bounds).lower.z;
    }
    else {
      pbVar11 = &local_50;
      (*(((this->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity)._vptr_Entity[3])(pbVar11);
      if (((local_50.upper.x < local_50.lower.x) || (local_50.upper.y < local_50.lower.y)) ||
         (local_50.upper.z < local_50.lower.z)) {
        (this->bounds).upper.y = local_50.upper.y;
        (this->bounds).upper.z = local_50.upper.z;
        (this->bounds).lower.x = local_50.lower.x;
        (this->bounds).lower.y = local_50.lower.y;
        *(ulong *)&(this->bounds).lower.z = CONCAT44(local_50.upper.x,local_50.lower.z);
      }
      else {
        fVar18 = (this->xfm).l.vx.z;
        fVar31 = local_50.lower.x * fVar18;
        fVar28 = (this->xfm).l.vy.z;
        fVar25 = local_50.lower.y * fVar28;
        fVar33 = fVar31 + fVar25;
        fVar26 = (this->xfm).l.vz.z;
        fVar20 = local_50.lower.z * fVar26;
        fVar19 = (this->xfm).p.z;
        fVar22 = fVar33 + fVar20 + fVar19;
        fVar21 = fVar22;
        if (3.4028235e+38 <= fVar22) {
          fVar21 = 3.4028235e+38;
        }
        if (fVar22 <= -3.4028235e+38) {
          fVar22 = -3.4028235e+38;
        }
        local_38 = ZEXT416((uint)local_50.upper.z);
        fVar26 = fVar26 * local_50.upper.z;
        fVar34 = fVar33 + fVar26 + fVar19;
        fVar33 = fVar34;
        if (fVar21 <= fVar34) {
          fVar33 = fVar21;
        }
        if (fVar34 <= fVar22) {
          fVar34 = fVar22;
        }
        fVar28 = fVar28 * local_50.upper.y;
        fVar31 = fVar31 + fVar28;
        fVar22 = fVar20 + fVar31 + fVar19;
        fVar21 = fVar22;
        if (fVar33 <= fVar22) {
          fVar21 = fVar33;
        }
        if (fVar22 <= fVar34) {
          fVar22 = fVar34;
        }
        fVar33 = fVar31 + fVar26 + fVar19;
        fVar31 = fVar33;
        if (fVar21 <= fVar33) {
          fVar31 = fVar21;
        }
        if (fVar33 <= fVar22) {
          fVar33 = fVar22;
        }
        fVar18 = fVar18 * local_50.upper.x;
        fVar25 = fVar25 + fVar18;
        fVar22 = fVar25 + fVar20 + fVar19;
        fVar21 = fVar22;
        if (fVar31 <= fVar22) {
          fVar21 = fVar31;
        }
        if (fVar22 <= fVar33) {
          fVar22 = fVar33;
        }
        fVar31 = fVar25 + fVar26 + fVar19;
        fVar25 = fVar31;
        if (fVar21 <= fVar31) {
          fVar25 = fVar21;
        }
        if (fVar31 <= fVar22) {
          fVar31 = fVar22;
        }
        fVar18 = fVar18 + fVar28;
        fVar21 = fVar20 + fVar18 + fVar19;
        fVar28 = fVar21;
        if (fVar25 <= fVar21) {
          fVar28 = fVar25;
        }
        if (fVar21 <= fVar31) {
          fVar21 = fVar31;
        }
        fVar19 = fVar18 + fVar26 + fVar19;
        fVar18 = fVar19;
        if (fVar28 <= fVar19) {
          fVar18 = fVar28;
        }
        uVar1 = (this->xfm).l.vx.x;
        uVar5 = (this->xfm).l.vx.y;
        uVar2 = (this->xfm).l.vy.x;
        uVar6 = (this->xfm).l.vy.y;
        uVar3 = (this->xfm).l.vz.x;
        uVar7 = (this->xfm).l.vz.y;
        fVar25 = local_50.lower.z * (float)uVar3;
        fVar31 = local_50.lower.z * (float)uVar7;
        fVar33 = local_50.lower.z * 0.0;
        local_50.lower.z = local_50.lower.z * 0.0;
        uVar4 = (this->xfm).p.x;
        uVar8 = (this->xfm).p.y;
        fVar34 = local_50.upper.z * (float)uVar3;
        fVar40 = local_50.upper.z * (float)uVar7;
        fVar41 = local_50.upper.z * 0.0;
        local_50.upper.z = local_50.upper.z * 0.0;
        fVar28 = local_50.lower.x * (float)uVar1 + local_50.lower.y * (float)uVar2;
        fVar26 = local_50.lower.x * (float)uVar5 + local_50.lower.y * (float)uVar6;
        fVar20 = local_50.lower.x * 0.0 + local_50.lower.y * 0.0;
        fVar22 = local_50.lower.x * 0.0 + local_50.lower.y * 0.0;
        auVar35._0_8_ = CONCAT44(fVar26 + fVar31 + (float)uVar8,fVar28 + fVar25 + (float)uVar4);
        auVar35._8_4_ = fVar20 + fVar33 + 0.0;
        auVar35._12_4_ = fVar22 + local_50.lower.z + 0.0;
        auVar38._8_4_ = auVar35._8_4_;
        auVar38._0_8_ = auVar35._0_8_;
        auVar38._12_4_ = auVar35._12_4_;
        auVar39 = minps(auVar38,_DAT_0014b290);
        auVar24._0_8_ = CONCAT44(fVar26 + fVar40 + (float)uVar8,fVar28 + fVar34 + (float)uVar4);
        auVar24._8_4_ = fVar20 + fVar41 + 0.0;
        auVar24._12_4_ = fVar22 + local_50.upper.z + 0.0;
        auVar29._8_4_ = auVar24._8_4_;
        auVar29._0_8_ = auVar24._0_8_;
        auVar29._12_4_ = auVar24._12_4_;
        auVar30 = minps(auVar29,auVar39);
        auVar39 = maxps(auVar35,_DAT_0014b280);
        auVar39 = maxps(auVar24,auVar39);
        fVar28 = local_50.lower.x * (float)uVar1 + local_50.upper.y * (float)uVar2;
        fVar26 = local_50.lower.x * (float)uVar5 + local_50.upper.y * (float)uVar6;
        fVar20 = local_50.lower.x * 0.0 + local_50.upper.y * 0.0;
        fVar22 = local_50.lower.x * 0.0 + local_50.upper.y * 0.0;
        auVar32._0_8_ = CONCAT44(fVar31 + fVar26 + (float)uVar8,fVar25 + fVar28 + (float)uVar4);
        auVar32._8_4_ = fVar33 + fVar20 + 0.0;
        auVar32._12_4_ = local_50.lower.z + fVar22 + 0.0;
        auVar36._8_4_ = auVar32._8_4_;
        auVar36._0_8_ = auVar32._0_8_;
        auVar36._12_4_ = auVar32._12_4_;
        auVar39 = maxps(auVar36,auVar39);
        auVar13._0_8_ = CONCAT44(fVar26 + fVar40 + (float)uVar8,fVar28 + fVar34 + (float)uVar4);
        auVar13._8_4_ = fVar20 + fVar41 + 0.0;
        auVar13._12_4_ = fVar22 + local_50.upper.z + 0.0;
        auVar14._8_4_ = auVar13._8_4_;
        auVar14._0_8_ = auVar13._0_8_;
        auVar14._12_4_ = auVar13._12_4_;
        auVar39 = maxps(auVar14,auVar39);
        fVar28 = local_50.lower.y * (float)uVar2 + local_50.upper.x * (float)uVar1;
        fVar26 = local_50.lower.y * (float)uVar6 + local_50.upper.x * (float)uVar5;
        fVar20 = local_50.lower.y * 0.0 + local_50.upper.x * 0.0;
        fVar22 = local_50.lower.y * 0.0 + local_50.upper.x * 0.0;
        auVar27._0_8_ = CONCAT44(fVar26 + fVar31 + (float)uVar8,fVar28 + fVar25 + (float)uVar4);
        auVar27._8_4_ = fVar20 + fVar33 + 0.0;
        auVar27._12_4_ = fVar22 + local_50.lower.z + 0.0;
        auVar37._8_4_ = auVar27._8_4_;
        auVar37._0_8_ = auVar27._0_8_;
        auVar37._12_4_ = auVar27._12_4_;
        auVar39 = maxps(auVar37,auVar39);
        auVar17._0_8_ = CONCAT44(fVar26 + fVar40 + (float)uVar8,fVar28 + fVar34 + (float)uVar4);
        auVar17._8_4_ = fVar20 + fVar41 + 0.0;
        auVar17._12_4_ = fVar22 + local_50.upper.z + 0.0;
        auVar15._8_4_ = auVar17._8_4_;
        auVar15._0_8_ = auVar17._0_8_;
        auVar15._12_4_ = auVar17._12_4_;
        auVar39 = maxps(auVar15,auVar39);
        fVar28 = local_50.upper.x * (float)uVar1 + local_50.upper.y * (float)uVar2;
        fVar26 = local_50.upper.x * (float)uVar5 + local_50.upper.y * (float)uVar6;
        fVar20 = local_50.upper.x * 0.0 + local_50.upper.y * 0.0;
        fVar22 = local_50.upper.x * 0.0 + local_50.upper.y * 0.0;
        auVar16._0_8_ = CONCAT44(fVar31 + fVar26 + (float)uVar8,fVar25 + fVar28 + (float)uVar4);
        auVar16._8_4_ = fVar33 + fVar20 + 0.0;
        auVar16._12_4_ = local_50.lower.z + fVar22 + 0.0;
        auVar23._8_4_ = auVar16._8_4_;
        auVar23._0_8_ = auVar16._0_8_;
        auVar23._12_4_ = auVar16._12_4_;
        auVar24 = maxps(auVar23,auVar39);
        auVar39._0_8_ = CONCAT44(fVar26 + fVar40 + (float)uVar8,fVar28 + fVar34 + (float)uVar4);
        auVar39._8_4_ = fVar20 + fVar41 + 0.0;
        auVar39._12_4_ = fVar22 + local_50.upper.z + 0.0;
        auVar30 = minps(auVar32,auVar30);
        auVar13 = minps(auVar13,auVar30);
        auVar13 = minps(auVar27,auVar13);
        auVar13 = minps(auVar17,auVar13);
        auVar13 = minps(auVar16,auVar13);
        auVar30._8_4_ = auVar39._8_4_;
        auVar30._0_8_ = auVar39._0_8_;
        auVar30._12_4_ = auVar39._12_4_;
        auVar13 = minps(auVar30,auVar13);
        auVar39 = maxps(auVar39,auVar24);
        if (fVar19 <= fVar21) {
          fVar19 = fVar21;
        }
        (this->bounds).lower.x = (float)(int)auVar13._0_8_;
        (this->bounds).lower.y = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
        (this->bounds).lower.z = fVar18;
        (this->bounds).upper.x = (float)(int)auVar39._0_8_;
        (this->bounds).upper.y = (float)(int)((ulong)auVar39._0_8_ >> 0x20);
        (this->bounds).upper.z = fVar19;
        pbVar11 = &this->bounds;
      }
      this->haveComputedBounds = true;
      fVar18 = (pbVar11->upper).z;
      (__return_storage_ptr__->upper).y = (pbVar11->upper).y;
      (__return_storage_ptr__->upper).z = fVar18;
      uVar10._0_4_ = (pbVar11->lower).x;
      uVar10._4_4_ = (pbVar11->lower).y;
      uVar12 = *(undefined8 *)&(pbVar11->lower).z;
    }
    (__return_storage_ptr__->lower).x = (float)(int)uVar10;
    (__return_storage_ptr__->lower).y = (float)(int)((ulong)uVar10 >> 0x20);
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar12;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

box3f Instance::getBounds() 
  {
    assert(object);
    
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    const box3f ob = object->getBounds();
    if (ob.empty()) {
      this->bounds = ob;
      haveComputedBounds = true;
      return ob;
    }

    box3f _bounds = box3f::empty_box();
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    this->bounds = _bounds;
    haveComputedBounds = true;
    return bounds;
  }